

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O0

void anon_unknown.dwarf_122bd8::destroyStaleFBOs(void)

{
  bool bVar1;
  pointer ppVar2;
  GLuint frameBuffer;
  iterator iter;
  Uint64 contextId;
  set<std::pair<unsigned_long_long,_unsigned_int>,_std::less<std::pair<unsigned_long_long,_unsigned_int>_>,_std::allocator<std::pair<unsigned_long_long,_unsigned_int>_>_>
  *in_stack_ffffffffffffffc8;
  iterator in_stack_ffffffffffffffd0;
  _Self in_stack_ffffffffffffffd8;
  uint local_1c;
  _Self local_18;
  _Self local_10;
  Uint64 local_8;
  
  local_8 = sf::Context::getActiveContextId();
  local_10._M_node =
       (_Base_ptr)
       std::
       set<std::pair<unsigned_long_long,_unsigned_int>,_std::less<std::pair<unsigned_long_long,_unsigned_int>_>,_std::allocator<std::pair<unsigned_long_long,_unsigned_int>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  while( true ) {
    local_18._M_node =
         (_Base_ptr)
         std::
         set<std::pair<unsigned_long_long,_unsigned_int>,_std::less<std::pair<unsigned_long_long,_unsigned_int>_>,_std::allocator<std::pair<unsigned_long_long,_unsigned_int>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(&local_10,&local_18);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<unsigned_long_long,_unsigned_int>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<unsigned_long_long,_unsigned_int>_> *)
                        in_stack_ffffffffffffffd0._M_node);
    if (ppVar2->first == local_8) {
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<unsigned_long_long,_unsigned_int>_>::
               operator->((_Rb_tree_const_iterator<std::pair<unsigned_long_long,_unsigned_int>_> *)
                          in_stack_ffffffffffffffd0._M_node);
      local_1c = ppVar2->second;
      (*sf_glad_glDeleteFramebuffersEXT)(1,&local_1c);
      in_stack_ffffffffffffffd8 =
           std::_Rb_tree_const_iterator<std::pair<unsigned_long_long,_unsigned_int>_>::operator++
                     (in_stack_ffffffffffffffd8._M_node,
                      (int)((ulong)in_stack_ffffffffffffffd0._M_node >> 0x20));
      in_stack_ffffffffffffffd0 =
           std::
           set<std::pair<unsigned_long_long,unsigned_int>,std::less<std::pair<unsigned_long_long,unsigned_int>>,std::allocator<std::pair<unsigned_long_long,unsigned_int>>>
           ::erase_abi_cxx11_(in_stack_ffffffffffffffd0._M_node,in_stack_ffffffffffffffd8._M_node);
    }
    else {
      std::_Rb_tree_const_iterator<std::pair<unsigned_long_long,_unsigned_int>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<unsigned_long_long,_unsigned_int>_> *)
                 in_stack_ffffffffffffffd0._M_node);
    }
  }
  return;
}

Assistant:

void destroyStaleFBOs()
    {
        sf::Uint64 contextId = sf::Context::getActiveContextId();

        for (std::set<std::pair<sf::Uint64, unsigned int> >::iterator iter = staleFrameBuffers.begin(); iter != staleFrameBuffers.end();)
        {
            if (iter->first == contextId)
            {
                GLuint frameBuffer = static_cast<GLuint>(iter->second);
                glCheck(GLEXT_glDeleteFramebuffers(1, &frameBuffer));

                staleFrameBuffers.erase(iter++);
            }
            else
            {
                ++iter;
            }
        }
    }